

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# responseproxy.cpp
# Opt level: O0

void int_tcfg_get(char *key,TRUN_ConfigItem *outValue)

{
  bool bVar1;
  Config *pCVar2;
  allocator<char> local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  allocator<char> local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  TRUN_ConfigItem *local_18;
  TRUN_ConfigItem *outValue_local;
  char *key_local;
  
  if ((key != (char *)0x0) && (outValue != (TRUN_ConfigItem *)0x0)) {
    local_18 = outValue;
    outValue_local = (TRUN_ConfigItem *)key;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"continue_on_assert",&local_39);
    bVar1 = std::operator==(&local_38,&outValue_local->isValid);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
    if (bVar1) {
      local_18->isValid = true;
      strncpy(local_18->name,&outValue_local->isValid,0x1f);
      local_18->value_type = kTRCfgType_Bool;
      pCVar2 = trun::Config::Instance();
      *(uint *)&local_18->value = (uint)(pCVar2->continueOnAssert & 1);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"enableThreadTestExecution",&local_71);
      bVar1 = std::operator==(&local_70,&outValue_local->isValid);
      std::__cxx11::string::~string((string *)&local_70);
      std::allocator<char>::~allocator(&local_71);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        local_18->isValid = true;
        strncpy(local_18->name,"enableThreadTestExecution",0x1f);
        local_18->value_type = kTRCfgType_Bool;
        (local_18->value).boolean = 1;
      }
    }
  }
  return;
}

Assistant:

static void int_tcfg_get(const char *key, TRUN_ConfigItem *outValue) {
    if (key == nullptr) {
        return;
    }
    if (outValue == nullptr) {
        return;
    }
    // test test
    if (key == std::string("continue_on_assert")) {
        outValue->isValid = true;
        strncpy(outValue->name, key, TR_CFG_ITEM_NAME_LEN-1);
        outValue->value_type = kTRCfgType_Bool;
        outValue->value.boolean = Config::Instance().continueOnAssert;
        return;
    }


    // TODO: Implement properly...
    if (key != std::string("enableThreadTestExecution")) {
        return;
    }
    outValue->isValid = true;
    strncpy(outValue->name,  "enableThreadTestExecution", TR_CFG_ITEM_NAME_LEN-1);
    outValue->value_type = kTRCfgType_Bool;
//    outValue->value.boolean = Config::Instance().enableThreadTestExecution;
    outValue->value.boolean = true;
}